

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  RTCRayQueryContext *pRVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  undefined1 (*pauVar14) [16];
  undefined4 uVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  undefined1 (*pauVar20) [16];
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar27;
  float fVar33;
  float fVar34;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar35;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  float fVar68;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  float fVar79;
  float fVar80;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar90;
  float fVar91;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar92;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar93;
  float fVar101;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar99;
  float fVar100;
  undefined1 auVar98 [64];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  undefined1 auVar109 [64];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar123;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar121;
  float fVar122;
  undefined1 auVar120 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  float fVar129;
  undefined1 auVar130 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  float fVar135;
  undefined1 auVar136 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  float fVar143;
  float fVar144;
  undefined1 auVar145 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar146 [64];
  float fVar150;
  float fVar151;
  undefined1 auVar152 [16];
  float fVar159;
  undefined1 auVar153 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar160;
  undefined1 auVar154 [64];
  float fVar161;
  float fVar162;
  undefined1 auVar163 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1389;
  ulong local_1388;
  undefined1 local_1380 [16];
  undefined8 local_1370;
  float fStack_1368;
  float fStack_1364;
  undefined8 local_1360;
  float fStack_1358;
  float fStack_1354;
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined8 local_1310;
  float fStack_1308;
  float fStack_1304;
  undefined1 local_1300 [16];
  size_t local_12f0;
  RayHitK<8> *local_12e8;
  undefined1 (*local_12e0) [16];
  undefined1 (*local_12d8) [16];
  long local_12d0;
  ulong local_12c8;
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  RTCFilterFunctionNArguments local_1290;
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 *local_1220;
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [16];
  undefined1 local_10d0 [16];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar20 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1120._4_4_ = uVar15;
  local_1120._0_4_ = uVar15;
  local_1120._8_4_ = uVar15;
  local_1120._12_4_ = uVar15;
  auVar109 = ZEXT1664(local_1120);
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1130._4_4_ = uVar15;
  local_1130._0_4_ = uVar15;
  local_1130._8_4_ = uVar15;
  local_1130._12_4_ = uVar15;
  auVar120 = ZEXT1664(local_1130);
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1140._4_4_ = uVar15;
  local_1140._0_4_ = uVar15;
  local_1140._8_4_ = uVar15;
  local_1140._12_4_ = uVar15;
  auVar128 = ZEXT1664(local_1140);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar28 = ZEXT416((uint)(fVar3 * 0.99999964));
  local_1150 = vshufps_avx(auVar28,auVar28,0);
  auVar131 = ZEXT1664(local_1150);
  auVar28 = ZEXT416((uint)(fVar4 * 0.99999964));
  local_1160 = vshufps_avx(auVar28,auVar28,0);
  auVar137 = ZEXT1664(local_1160);
  auVar28 = ZEXT416((uint)(fVar5 * 0.99999964));
  local_1170 = vshufps_avx(auVar28,auVar28,0);
  auVar142 = ZEXT1664(local_1170);
  auVar28 = ZEXT416((uint)(fVar3 * 1.0000004));
  local_1180 = vshufps_avx(auVar28,auVar28,0);
  auVar146 = ZEXT1664(local_1180);
  auVar28 = ZEXT416((uint)(fVar4 * 1.0000004));
  local_1190 = vshufps_avx(auVar28,auVar28,0);
  auVar154 = ZEXT1664(local_1190);
  auVar28 = ZEXT416((uint)(fVar5 * 1.0000004));
  local_11a0 = vshufps_avx(auVar28,auVar28,0);
  auVar164 = ZEXT1664(local_11a0);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_12c8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar26 = uVar22 ^ 0x10;
  uVar23 = local_12c8 ^ 0x10;
  iVar6 = (tray->tnear).field_0.i[k];
  local_1260._4_4_ = iVar6;
  local_1260._0_4_ = iVar6;
  local_1260._8_4_ = iVar6;
  local_1260._12_4_ = iVar6;
  auVar98 = ZEXT1664(local_1260);
  uVar19 = 1 << ((byte)k & 0x1f);
  iVar6 = (tray->tfar).field_0.i[k];
  auVar32 = ZEXT1664(CONCAT412(iVar6,CONCAT48(iVar6,CONCAT44(iVar6,iVar6))));
  local_12d8 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar19 & 0xf) << 4));
  local_12e0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar19 >> 4) * 0x10);
  local_1388 = uVar22;
  local_12f0 = k;
  local_12e8 = ray;
LAB_00f6bf71:
  do {
    do {
      if (pauVar20 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar14 = pauVar20 + -1;
      pauVar20 = pauVar20 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar14 + 8));
    uVar24 = *(ulong *)*pauVar20;
    while ((uVar24 & 8) == 0) {
      uVar16 = uVar24 & 0xfffffffffffffff0;
      fVar3 = *(float *)(ray + k * 4 + 0xe0);
      auVar36._4_4_ = fVar3;
      auVar36._0_4_ = fVar3;
      auVar36._8_4_ = fVar3;
      auVar36._12_4_ = fVar3;
      pfVar2 = (float *)(uVar16 + 0x80 + uVar22);
      pfVar1 = (float *)(uVar16 + 0x20 + uVar22);
      auVar28._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar28._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar28._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar28._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar28 = vsubps_avx(auVar28,auVar109._0_16_);
      auVar37._0_4_ = auVar131._0_4_ * auVar28._0_4_;
      auVar37._4_4_ = auVar131._4_4_ * auVar28._4_4_;
      auVar37._8_4_ = auVar131._8_4_ * auVar28._8_4_;
      auVar37._12_4_ = auVar131._12_4_ * auVar28._12_4_;
      pfVar2 = (float *)(uVar16 + 0x80 + local_12c8);
      auVar28 = vmaxps_avx(auVar98._0_16_,auVar37);
      pfVar1 = (float *)(uVar16 + 0x20 + local_12c8);
      auVar57._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar57._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar57._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar57._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar37 = vsubps_avx(auVar57,auVar120._0_16_);
      pfVar2 = (float *)(uVar16 + 0x80 + uVar25);
      pfVar1 = (float *)(uVar16 + 0x20 + uVar25);
      auVar71._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar71._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar71._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar71._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar58._0_4_ = auVar137._0_4_ * auVar37._0_4_;
      auVar58._4_4_ = auVar137._4_4_ * auVar37._4_4_;
      auVar58._8_4_ = auVar137._8_4_ * auVar37._8_4_;
      auVar58._12_4_ = auVar137._12_4_ * auVar37._12_4_;
      auVar37 = vsubps_avx(auVar71,auVar128._0_16_);
      auVar72._0_4_ = auVar142._0_4_ * auVar37._0_4_;
      auVar72._4_4_ = auVar142._4_4_ * auVar37._4_4_;
      auVar72._8_4_ = auVar142._8_4_ * auVar37._8_4_;
      auVar72._12_4_ = auVar142._12_4_ * auVar37._12_4_;
      auVar37 = vmaxps_avx(auVar58,auVar72);
      pfVar2 = (float *)(uVar16 + 0x80 + uVar26);
      pfVar1 = (float *)(uVar16 + 0x20 + uVar26);
      auVar73._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar73._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar73._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar73._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar28 = vmaxps_avx(auVar28,auVar37);
      auVar37 = vsubps_avx(auVar73,auVar109._0_16_);
      auVar59._0_4_ = auVar146._0_4_ * auVar37._0_4_;
      auVar59._4_4_ = auVar146._4_4_ * auVar37._4_4_;
      auVar59._8_4_ = auVar146._8_4_ * auVar37._8_4_;
      auVar59._12_4_ = auVar146._12_4_ * auVar37._12_4_;
      auVar37 = vminps_avx(auVar32._0_16_,auVar59);
      pfVar2 = (float *)(uVar16 + 0x80 + uVar23);
      pfVar1 = (float *)(uVar16 + 0x20 + uVar23);
      auVar74._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar74._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar74._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar74._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar57 = vsubps_avx(auVar74,auVar120._0_16_);
      auVar75._0_4_ = auVar154._0_4_ * auVar57._0_4_;
      auVar75._4_4_ = auVar154._4_4_ * auVar57._4_4_;
      auVar75._8_4_ = auVar154._8_4_ * auVar57._8_4_;
      auVar75._12_4_ = auVar154._12_4_ * auVar57._12_4_;
      pfVar2 = (float *)(uVar16 + 0x80 + (uVar25 ^ 0x10));
      pfVar1 = (float *)(uVar16 + 0x20 + (uVar25 ^ 0x10));
      auVar83._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar83._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar83._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar83._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar57 = vsubps_avx(auVar83,auVar128._0_16_);
      auVar84._0_4_ = auVar164._0_4_ * auVar57._0_4_;
      auVar84._4_4_ = auVar164._4_4_ * auVar57._4_4_;
      auVar84._8_4_ = auVar164._8_4_ * auVar57._8_4_;
      auVar84._12_4_ = auVar164._12_4_ * auVar57._12_4_;
      auVar57 = vminps_avx(auVar75,auVar84);
      auVar37 = vminps_avx(auVar37,auVar57);
      if (((uint)uVar24 & 7) == 6) {
        auVar57 = vcmpps_avx(auVar28,auVar37,2);
        auVar37 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar36,2);
        auVar36 = vcmpps_avx(auVar36,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
        auVar37 = vandps_avx(auVar37,auVar36);
        auVar37 = vandps_avx(auVar37,auVar57);
      }
      else {
        auVar37 = vcmpps_avx(auVar28,auVar37,2);
      }
      auVar37 = vpslld_avx(auVar37,0x1f);
      uVar19 = vmovmskps_avx(auVar37);
      local_10c0[0] = (RTCHitN)auVar28[0];
      local_10c0[1] = (RTCHitN)auVar28[1];
      local_10c0[2] = (RTCHitN)auVar28[2];
      local_10c0[3] = (RTCHitN)auVar28[3];
      local_10c0[4] = (RTCHitN)auVar28[4];
      local_10c0[5] = (RTCHitN)auVar28[5];
      local_10c0[6] = (RTCHitN)auVar28[6];
      local_10c0[7] = (RTCHitN)auVar28[7];
      local_10c0[8] = (RTCHitN)auVar28[8];
      local_10c0[9] = (RTCHitN)auVar28[9];
      local_10c0[10] = (RTCHitN)auVar28[10];
      local_10c0[0xb] = (RTCHitN)auVar28[0xb];
      local_10c0[0xc] = (RTCHitN)auVar28[0xc];
      local_10c0[0xd] = (RTCHitN)auVar28[0xd];
      local_10c0[0xe] = (RTCHitN)auVar28[0xe];
      local_10c0[0xf] = (RTCHitN)auVar28[0xf];
      if (uVar19 == 0) goto LAB_00f6bf71;
      uVar19 = uVar19 & 0xff;
      lVar21 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      uVar24 = *(ulong *)(uVar16 + lVar21 * 8);
      uVar19 = uVar19 - 1 & uVar19;
      if (uVar19 != 0) {
        uVar8 = *(uint *)(local_10c0 + lVar21 * 4);
        lVar21 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar16 + lVar21 * 8);
        uVar9 = *(uint *)(local_10c0 + lVar21 * 4);
        uVar19 = uVar19 - 1 & uVar19;
        uVar22 = local_1388;
        if (uVar19 == 0) {
          if (uVar8 < uVar9) {
            *(ulong *)*pauVar20 = uVar10;
            *(uint *)(*pauVar20 + 8) = uVar9;
            pauVar20 = pauVar20 + 1;
          }
          else {
            *(ulong *)*pauVar20 = uVar24;
            *(uint *)(*pauVar20 + 8) = uVar8;
            pauVar20 = pauVar20 + 1;
            uVar24 = uVar10;
          }
        }
        else {
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar24;
          auVar28 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar8));
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar10;
          auVar37 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar9));
          lVar21 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)(uVar16 + lVar21 * 8);
          auVar36 = vpunpcklqdq_avx(auVar60,ZEXT416(*(uint *)(local_10c0 + lVar21 * 4)));
          auVar57 = vpcmpgtd_avx(auVar37,auVar28);
          uVar19 = uVar19 - 1 & uVar19;
          if (uVar19 == 0) {
            auVar58 = vpshufd_avx(auVar57,0xaa);
            auVar57 = vblendvps_avx(auVar37,auVar28,auVar58);
            auVar28 = vblendvps_avx(auVar28,auVar37,auVar58);
            auVar37 = vpcmpgtd_avx(auVar36,auVar57);
            auVar58 = vpshufd_avx(auVar37,0xaa);
            auVar37 = vblendvps_avx(auVar36,auVar57,auVar58);
            auVar57 = vblendvps_avx(auVar57,auVar36,auVar58);
            auVar36 = vpcmpgtd_avx(auVar57,auVar28);
            auVar58 = vpshufd_avx(auVar36,0xaa);
            auVar36 = vblendvps_avx(auVar57,auVar28,auVar58);
            auVar28 = vblendvps_avx(auVar28,auVar57,auVar58);
            *pauVar20 = auVar28;
            pauVar20[1] = auVar36;
            uVar24 = auVar37._0_8_;
            pauVar20 = pauVar20 + 2;
          }
          else {
            lVar21 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            auVar85._8_8_ = 0;
            auVar85._0_8_ = *(ulong *)(uVar16 + lVar21 * 8);
            auVar59 = vpunpcklqdq_avx(auVar85,ZEXT416(*(uint *)(local_10c0 + lVar21 * 4)));
            auVar58 = vpshufd_avx(auVar57,0xaa);
            auVar57 = vblendvps_avx(auVar37,auVar28,auVar58);
            auVar28 = vblendvps_avx(auVar28,auVar37,auVar58);
            auVar37 = vpcmpgtd_avx(auVar59,auVar36);
            auVar58 = vpshufd_avx(auVar37,0xaa);
            auVar37 = vblendvps_avx(auVar59,auVar36,auVar58);
            auVar36 = vblendvps_avx(auVar36,auVar59,auVar58);
            auVar58 = vpcmpgtd_avx(auVar36,auVar28);
            auVar59 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar36,auVar28,auVar59);
            auVar28 = vblendvps_avx(auVar28,auVar36,auVar59);
            auVar36 = vpcmpgtd_avx(auVar37,auVar57);
            auVar59 = vpshufd_avx(auVar36,0xaa);
            auVar36 = vblendvps_avx(auVar37,auVar57,auVar59);
            auVar37 = vblendvps_avx(auVar57,auVar37,auVar59);
            auVar57 = vpcmpgtd_avx(auVar58,auVar37);
            auVar59 = vpshufd_avx(auVar57,0xaa);
            auVar57 = vblendvps_avx(auVar58,auVar37,auVar59);
            auVar37 = vblendvps_avx(auVar37,auVar58,auVar59);
            *pauVar20 = auVar28;
            pauVar20[1] = auVar37;
            pauVar20[2] = auVar57;
            auVar98 = ZEXT1664(local_1260);
            uVar24 = auVar36._0_8_;
            pauVar20 = pauVar20 + 3;
          }
        }
      }
    }
    local_12d0 = (ulong)((uint)uVar24 & 0xf) - 8;
    uVar24 = uVar24 & 0xfffffffffffffff0;
    for (lVar21 = 0; lVar21 != local_12d0; lVar21 = lVar21 + 1) {
      lVar18 = lVar21 * 0x140;
      fVar3 = *(float *)(ray + k * 4 + 0xe0);
      pfVar2 = (float *)(uVar24 + 0x90 + lVar18);
      pfVar1 = (float *)(uVar24 + lVar18);
      auVar152._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar152._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar152._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar152._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      pfVar2 = (float *)(uVar24 + 0xa0 + lVar18);
      pfVar1 = (float *)(uVar24 + 0x10 + lVar18);
      auVar46._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar46._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar46._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar46._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      pfVar2 = (float *)(uVar24 + 0xb0 + lVar18);
      pfVar1 = (float *)(uVar24 + 0x20 + lVar18);
      auVar136._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar136._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar136._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar136._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      pfVar2 = (float *)(uVar24 + 0xc0 + lVar18);
      pfVar1 = (float *)(uVar24 + 0x30 + lVar18);
      auVar76._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar76._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar76._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar76._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      pfVar2 = (float *)(uVar24 + 0xd0 + lVar18);
      pfVar1 = (float *)(uVar24 + 0x40 + lVar18);
      auVar86._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar86._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar86._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar86._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      pfVar2 = (float *)(uVar24 + 0xe0 + lVar18);
      pfVar1 = (float *)(uVar24 + 0x50 + lVar18);
      auVar39._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar39._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar39._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar39._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      pfVar2 = (float *)(uVar24 + 0xf0 + lVar18);
      pfVar1 = (float *)(uVar24 + 0x60 + lVar18);
      auVar163._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar163._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar163._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar163._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      pfVar2 = (float *)(uVar24 + 0x100 + lVar18);
      pfVar1 = (float *)(uVar24 + 0x70 + lVar18);
      auVar112._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar112._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar112._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar112._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      pfVar1 = (float *)(uVar24 + 0x110 + lVar18);
      pfVar2 = (float *)(uVar24 + 0x80 + lVar18);
      auVar124._0_4_ = fVar3 * *pfVar1 + *pfVar2;
      auVar124._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
      auVar124._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
      auVar124._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
      uVar15 = *(undefined4 *)(ray + k * 4);
      auVar130._4_4_ = uVar15;
      auVar130._0_4_ = uVar15;
      auVar130._8_4_ = uVar15;
      auVar130._12_4_ = uVar15;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar141._4_4_ = uVar15;
      auVar141._0_4_ = uVar15;
      auVar141._8_4_ = uVar15;
      auVar141._12_4_ = uVar15;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar145._4_4_ = uVar15;
      auVar145._0_4_ = uVar15;
      auVar145._8_4_ = uVar15;
      auVar145._12_4_ = uVar15;
      local_1320 = vsubps_avx(auVar152,auVar130);
      local_1380 = vsubps_avx(auVar46,auVar141);
      local_1330 = vsubps_avx(auVar136,auVar145);
      auVar28 = vsubps_avx(auVar76,auVar130);
      auVar37 = vsubps_avx(auVar86,auVar141);
      auVar57 = vsubps_avx(auVar39,auVar145);
      auVar36 = vsubps_avx(auVar163,auVar130);
      auVar58 = vsubps_avx(auVar112,auVar141);
      auVar59 = vsubps_avx(auVar124,auVar145);
      auVar71 = vsubps_avx(auVar36,local_1320);
      auVar72 = vsubps_avx(auVar58,local_1380);
      local_10d0 = vsubps_avx(auVar59,local_1330);
      fVar3 = local_1380._0_4_;
      fVar70 = auVar58._0_4_ + fVar3;
      fVar5 = local_1380._4_4_;
      fVar79 = auVar58._4_4_ + fVar5;
      fVar68 = local_1380._8_4_;
      fVar80 = auVar58._8_4_ + fVar68;
      fVar102 = local_1380._12_4_;
      fVar81 = auVar58._12_4_ + fVar102;
      fVar150 = local_1330._0_4_;
      fVar82 = fVar150 + auVar59._0_4_;
      fVar155 = local_1330._4_4_;
      fVar90 = fVar155 + auVar59._4_4_;
      fVar157 = local_1330._8_4_;
      fVar91 = fVar157 + auVar59._8_4_;
      fVar159 = local_1330._12_4_;
      fVar92 = fVar159 + auVar59._12_4_;
      fVar27 = local_10d0._0_4_;
      auVar113._0_4_ = fVar70 * fVar27;
      fVar33 = local_10d0._4_4_;
      auVar113._4_4_ = fVar79 * fVar33;
      fVar34 = local_10d0._8_4_;
      auVar113._8_4_ = fVar80 * fVar34;
      fVar35 = local_10d0._12_4_;
      auVar113._12_4_ = fVar81 * fVar35;
      fVar161 = auVar72._0_4_;
      auVar125._0_4_ = fVar161 * fVar82;
      fVar165 = auVar72._4_4_;
      auVar125._4_4_ = fVar165 * fVar90;
      fVar167 = auVar72._8_4_;
      auVar125._8_4_ = fVar167 * fVar91;
      fVar169 = auVar72._12_4_;
      auVar125._12_4_ = fVar169 * fVar92;
      auVar72 = vsubps_avx(auVar125,auVar113);
      fVar4 = local_1320._0_4_;
      fVar111 = auVar36._0_4_ + fVar4;
      fVar13 = local_1320._4_4_;
      fVar121 = auVar36._4_4_ + fVar13;
      fVar69 = local_1320._8_4_;
      fVar122 = auVar36._8_4_ + fVar69;
      fVar110 = local_1320._12_4_;
      fVar123 = auVar36._12_4_ + fVar110;
      fVar129 = auVar71._0_4_;
      auVar87._0_4_ = fVar129 * fVar82;
      fVar132 = auVar71._4_4_;
      auVar87._4_4_ = fVar132 * fVar90;
      fVar133 = auVar71._8_4_;
      auVar87._8_4_ = fVar133 * fVar91;
      fVar134 = auVar71._12_4_;
      auVar87._12_4_ = fVar134 * fVar92;
      auVar126._0_4_ = fVar111 * fVar27;
      auVar126._4_4_ = fVar121 * fVar33;
      auVar126._8_4_ = fVar122 * fVar34;
      auVar126._12_4_ = fVar123 * fVar35;
      auVar71 = vsubps_avx(auVar126,auVar87);
      auVar114._0_4_ = fVar111 * fVar161;
      auVar114._4_4_ = fVar121 * fVar165;
      auVar114._8_4_ = fVar122 * fVar167;
      auVar114._12_4_ = fVar123 * fVar169;
      auVar77._0_4_ = fVar129 * fVar70;
      auVar77._4_4_ = fVar132 * fVar79;
      auVar77._8_4_ = fVar133 * fVar80;
      auVar77._12_4_ = fVar134 * fVar81;
      auVar73 = vsubps_avx(auVar77,auVar114);
      local_1370._4_4_ = *(float *)(ray + k * 4 + 0xc0);
      local_1310._4_4_ = *(float *)(ray + k * 4 + 0xa0);
      local_1360._4_4_ = *(float *)(ray + k * 4 + 0x80);
      local_1250._0_4_ =
           auVar72._0_4_ * local_1360._4_4_ +
           local_1370._4_4_ * auVar73._0_4_ + local_1310._4_4_ * auVar71._0_4_;
      local_1250._4_4_ =
           auVar72._4_4_ * local_1360._4_4_ +
           local_1370._4_4_ * auVar73._4_4_ + local_1310._4_4_ * auVar71._4_4_;
      local_1250._8_4_ =
           auVar72._8_4_ * local_1360._4_4_ +
           local_1370._4_4_ * auVar73._8_4_ + local_1310._4_4_ * auVar71._8_4_;
      local_1250._12_4_ =
           auVar72._12_4_ * local_1360._4_4_ +
           local_1370._4_4_ * auVar73._12_4_ + local_1310._4_4_ * auVar71._12_4_;
      local_10e0 = vsubps_avx(local_1380,auVar37);
      auVar71 = vsubps_avx(local_1330,auVar57);
      fVar70 = auVar37._0_4_ + fVar3;
      fVar79 = auVar37._4_4_ + fVar5;
      fVar80 = auVar37._8_4_ + fVar68;
      fVar81 = auVar37._12_4_ + fVar102;
      fVar82 = fVar150 + auVar57._0_4_;
      fVar90 = fVar155 + auVar57._4_4_;
      fVar91 = fVar157 + auVar57._8_4_;
      fVar92 = fVar159 + auVar57._12_4_;
      fVar162 = auVar71._0_4_;
      auVar153._0_4_ = fVar162 * fVar70;
      fVar166 = auVar71._4_4_;
      auVar153._4_4_ = fVar166 * fVar79;
      fVar168 = auVar71._8_4_;
      auVar153._8_4_ = fVar168 * fVar80;
      fVar170 = auVar71._12_4_;
      auVar153._12_4_ = fVar170 * fVar81;
      fVar143 = local_10e0._0_4_;
      auVar61._0_4_ = fVar143 * fVar82;
      fVar147 = local_10e0._4_4_;
      auVar61._4_4_ = fVar147 * fVar90;
      fVar148 = local_10e0._8_4_;
      auVar61._8_4_ = fVar148 * fVar91;
      fVar149 = local_10e0._12_4_;
      auVar61._12_4_ = fVar149 * fVar92;
      auVar71 = vsubps_avx(auVar61,auVar153);
      auVar72 = vsubps_avx(local_1320,auVar28);
      fVar135 = auVar72._0_4_;
      auVar88._0_4_ = fVar135 * fVar82;
      fVar138 = auVar72._4_4_;
      auVar88._4_4_ = fVar138 * fVar90;
      fVar139 = auVar72._8_4_;
      auVar88._8_4_ = fVar139 * fVar91;
      fVar140 = auVar72._12_4_;
      auVar88._12_4_ = fVar140 * fVar92;
      fVar82 = auVar28._0_4_ + fVar4;
      fVar90 = auVar28._4_4_ + fVar13;
      fVar91 = auVar28._8_4_ + fVar69;
      fVar92 = auVar28._12_4_ + fVar110;
      auVar115._0_4_ = fVar162 * fVar82;
      auVar115._4_4_ = fVar166 * fVar90;
      auVar115._8_4_ = fVar168 * fVar91;
      auVar115._12_4_ = fVar170 * fVar92;
      auVar72 = vsubps_avx(auVar115,auVar88);
      auVar103._0_4_ = fVar143 * fVar82;
      auVar103._4_4_ = fVar147 * fVar90;
      auVar103._8_4_ = fVar148 * fVar91;
      auVar103._12_4_ = fVar149 * fVar92;
      auVar78._0_4_ = fVar135 * fVar70;
      auVar78._4_4_ = fVar138 * fVar79;
      auVar78._8_4_ = fVar139 * fVar80;
      auVar78._12_4_ = fVar140 * fVar81;
      auVar73 = vsubps_avx(auVar78,auVar103);
      local_1240._0_4_ =
           local_1360._4_4_ * auVar71._0_4_ +
           local_1370._4_4_ * auVar73._0_4_ + local_1310._4_4_ * auVar72._0_4_;
      local_1240._4_4_ =
           local_1360._4_4_ * auVar71._4_4_ +
           local_1370._4_4_ * auVar73._4_4_ + local_1310._4_4_ * auVar72._4_4_;
      local_1240._8_4_ =
           local_1360._4_4_ * auVar71._8_4_ +
           local_1370._4_4_ * auVar73._8_4_ + local_1310._4_4_ * auVar72._8_4_;
      local_1240._12_4_ =
           local_1360._4_4_ * auVar71._12_4_ +
           local_1370._4_4_ * auVar73._12_4_ + local_1310._4_4_ * auVar72._12_4_;
      auVar71 = vsubps_avx(auVar28,auVar36);
      fVar70 = auVar28._0_4_ + auVar36._0_4_;
      fVar79 = auVar28._4_4_ + auVar36._4_4_;
      fVar80 = auVar28._8_4_ + auVar36._8_4_;
      fVar81 = auVar28._12_4_ + auVar36._12_4_;
      auVar28 = vsubps_avx(auVar37,auVar58);
      fVar82 = auVar37._0_4_ + auVar58._0_4_;
      fVar90 = auVar37._4_4_ + auVar58._4_4_;
      fVar91 = auVar37._8_4_ + auVar58._8_4_;
      fVar92 = auVar37._12_4_ + auVar58._12_4_;
      auVar37 = vsubps_avx(auVar57,auVar59);
      fVar93 = auVar57._0_4_ + auVar59._0_4_;
      fVar99 = auVar57._4_4_ + auVar59._4_4_;
      fVar100 = auVar57._8_4_ + auVar59._8_4_;
      fVar101 = auVar57._12_4_ + auVar59._12_4_;
      fVar151 = auVar37._0_4_;
      auVar104._0_4_ = fVar151 * fVar82;
      fVar156 = auVar37._4_4_;
      auVar104._4_4_ = fVar156 * fVar90;
      fVar158 = auVar37._8_4_;
      auVar104._8_4_ = fVar158 * fVar91;
      fVar160 = auVar37._12_4_;
      auVar104._12_4_ = fVar160 * fVar92;
      fVar111 = auVar28._0_4_;
      auVar116._0_4_ = fVar111 * fVar93;
      fVar121 = auVar28._4_4_;
      auVar116._4_4_ = fVar121 * fVar99;
      fVar122 = auVar28._8_4_;
      auVar116._8_4_ = fVar122 * fVar100;
      fVar123 = auVar28._12_4_;
      auVar116._12_4_ = fVar123 * fVar101;
      auVar28 = vsubps_avx(auVar116,auVar104);
      fVar144 = auVar71._0_4_;
      auVar94._0_4_ = fVar144 * fVar93;
      fVar93 = auVar71._4_4_;
      auVar94._4_4_ = fVar93 * fVar99;
      fVar99 = auVar71._8_4_;
      auVar94._8_4_ = fVar99 * fVar100;
      fVar100 = auVar71._12_4_;
      auVar94._12_4_ = fVar100 * fVar101;
      auVar117._0_4_ = fVar151 * fVar70;
      auVar117._4_4_ = fVar156 * fVar79;
      auVar117._8_4_ = fVar158 * fVar80;
      auVar117._12_4_ = fVar160 * fVar81;
      auVar37 = vsubps_avx(auVar117,auVar94);
      auVar47._0_4_ = fVar70 * fVar111;
      auVar47._4_4_ = fVar79 * fVar121;
      auVar47._8_4_ = fVar80 * fVar122;
      auVar47._12_4_ = fVar81 * fVar123;
      auVar62._0_4_ = fVar144 * fVar82;
      auVar62._4_4_ = fVar93 * fVar90;
      auVar62._8_4_ = fVar99 * fVar91;
      auVar62._12_4_ = fVar100 * fVar92;
      auVar57 = vsubps_avx(auVar62,auVar47);
      local_1370._0_4_ = local_1370._4_4_;
      fStack_1368 = local_1370._4_4_;
      fStack_1364 = local_1370._4_4_;
      local_1310._0_4_ = local_1310._4_4_;
      fStack_1308 = local_1310._4_4_;
      fStack_1304 = local_1310._4_4_;
      local_1360._0_4_ = local_1360._4_4_;
      fStack_1358 = local_1360._4_4_;
      fStack_1354 = local_1360._4_4_;
      auVar48._0_4_ =
           local_1360._4_4_ * auVar28._0_4_ +
           local_1370._4_4_ * auVar57._0_4_ + local_1310._4_4_ * auVar37._0_4_;
      auVar48._4_4_ =
           local_1360._4_4_ * auVar28._4_4_ +
           local_1370._4_4_ * auVar57._4_4_ + local_1310._4_4_ * auVar37._4_4_;
      auVar48._8_4_ =
           local_1360._4_4_ * auVar28._8_4_ +
           local_1370._4_4_ * auVar57._8_4_ + local_1310._4_4_ * auVar37._8_4_;
      auVar48._12_4_ =
           local_1360._4_4_ * auVar28._12_4_ +
           local_1370._4_4_ * auVar57._12_4_ + local_1310._4_4_ * auVar37._12_4_;
      local_1230._0_4_ = auVar48._0_4_ + local_1250._0_4_ + local_1240._0_4_;
      local_1230._4_4_ = auVar48._4_4_ + local_1250._4_4_ + local_1240._4_4_;
      local_1230._8_4_ = auVar48._8_4_ + local_1250._8_4_ + local_1240._8_4_;
      local_1230._12_4_ = auVar48._12_4_ + local_1250._12_4_ + local_1240._12_4_;
      auVar28 = vminps_avx(local_1250,local_1240);
      auVar28 = vminps_avx(auVar28,auVar48);
      auVar95._8_4_ = 0x7fffffff;
      auVar95._0_8_ = 0x7fffffff7fffffff;
      auVar95._12_4_ = 0x7fffffff;
      local_1110 = vandps_avx(local_1230,auVar95);
      auVar96._0_4_ = local_1110._0_4_ * 1.1920929e-07;
      auVar96._4_4_ = local_1110._4_4_ * 1.1920929e-07;
      auVar96._8_4_ = local_1110._8_4_ * 1.1920929e-07;
      auVar96._12_4_ = local_1110._12_4_ * 1.1920929e-07;
      uVar16 = CONCAT44(auVar96._4_4_,auVar96._0_4_);
      auVar105._0_8_ = uVar16 ^ 0x8000000080000000;
      auVar105._8_4_ = -auVar96._8_4_;
      auVar105._12_4_ = -auVar96._12_4_;
      auVar28 = vcmpps_avx(auVar28,auVar105,5);
      local_10f0 = local_1250;
      local_1100 = local_1240;
      auVar37 = vmaxps_avx(local_1250,local_1240);
      auVar37 = vmaxps_avx(auVar37,auVar48);
      auVar37 = vcmpps_avx(auVar37,auVar96,2);
      auVar28 = vorps_avx(auVar28,auVar37);
      if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0'
         ) {
        auVar49._0_4_ = fVar143 * fVar27;
        auVar49._4_4_ = fVar147 * fVar33;
        auVar49._8_4_ = fVar148 * fVar34;
        auVar49._12_4_ = fVar149 * fVar35;
        auVar63._0_4_ = fVar162 * fVar161;
        auVar63._4_4_ = fVar166 * fVar165;
        auVar63._8_4_ = fVar168 * fVar167;
        auVar63._12_4_ = fVar170 * fVar169;
        auVar36 = vsubps_avx(auVar63,auVar49);
        auVar97._0_4_ = fVar111 * fVar162;
        auVar97._4_4_ = fVar121 * fVar166;
        auVar97._8_4_ = fVar122 * fVar168;
        auVar97._12_4_ = fVar123 * fVar170;
        auVar106._0_4_ = fVar143 * fVar151;
        auVar106._4_4_ = fVar147 * fVar156;
        auVar106._8_4_ = fVar148 * fVar158;
        auVar106._12_4_ = fVar149 * fVar160;
        auVar58 = vsubps_avx(auVar106,auVar97);
        auVar118._8_4_ = 0x7fffffff;
        auVar118._0_8_ = 0x7fffffff7fffffff;
        auVar118._12_4_ = 0x7fffffff;
        auVar37 = vandps_avx(auVar118,auVar49);
        auVar57 = vandps_avx(auVar118,auVar97);
        auVar37 = vcmpps_avx(auVar37,auVar57,1);
        local_11d0 = vblendvps_avx(auVar58,auVar36,auVar37);
        auVar40._0_4_ = fVar135 * fVar151;
        auVar40._4_4_ = fVar138 * fVar156;
        auVar40._8_4_ = fVar139 * fVar158;
        auVar40._12_4_ = fVar140 * fVar160;
        auVar50._0_4_ = fVar135 * fVar27;
        auVar50._4_4_ = fVar138 * fVar33;
        auVar50._8_4_ = fVar139 * fVar34;
        auVar50._12_4_ = fVar140 * fVar35;
        auVar64._0_4_ = fVar129 * fVar162;
        auVar64._4_4_ = fVar132 * fVar166;
        auVar64._8_4_ = fVar133 * fVar168;
        auVar64._12_4_ = fVar134 * fVar170;
        auVar36 = vsubps_avx(auVar50,auVar64);
        auVar107._0_4_ = fVar162 * fVar144;
        auVar107._4_4_ = fVar166 * fVar93;
        auVar107._8_4_ = fVar168 * fVar99;
        auVar107._12_4_ = fVar170 * fVar100;
        auVar58 = vsubps_avx(auVar107,auVar40);
        auVar37 = vandps_avx(auVar118,auVar64);
        auVar57 = vandps_avx(auVar118,auVar40);
        auVar37 = vcmpps_avx(auVar37,auVar57,1);
        local_11c0 = vblendvps_avx(auVar58,auVar36,auVar37);
        auVar51._0_4_ = fVar143 * fVar144;
        auVar51._4_4_ = fVar147 * fVar93;
        auVar51._8_4_ = fVar148 * fVar99;
        auVar51._12_4_ = fVar149 * fVar100;
        auVar65._0_4_ = fVar129 * fVar143;
        auVar65._4_4_ = fVar132 * fVar147;
        auVar65._8_4_ = fVar133 * fVar148;
        auVar65._12_4_ = fVar134 * fVar149;
        auVar89._0_4_ = fVar135 * fVar161;
        auVar89._4_4_ = fVar138 * fVar165;
        auVar89._8_4_ = fVar139 * fVar167;
        auVar89._12_4_ = fVar140 * fVar169;
        auVar29._0_4_ = fVar135 * fVar111;
        auVar29._4_4_ = fVar138 * fVar121;
        auVar29._8_4_ = fVar139 * fVar122;
        auVar29._12_4_ = fVar140 * fVar123;
        auVar36 = vsubps_avx(auVar65,auVar89);
        auVar58 = vsubps_avx(auVar29,auVar51);
        auVar37 = vandps_avx(auVar118,auVar89);
        auVar57 = vandps_avx(auVar118,auVar51);
        auVar37 = vcmpps_avx(auVar37,auVar57,1);
        local_11b0 = vblendvps_avx(auVar58,auVar36,auVar37);
        fVar27 = local_11d0._0_4_ * local_1360._4_4_ +
                 local_11b0._0_4_ * local_1370._4_4_ + local_11c0._0_4_ * local_1310._4_4_;
        fVar33 = local_11d0._4_4_ * local_1360._4_4_ +
                 local_11b0._4_4_ * local_1370._4_4_ + local_11c0._4_4_ * local_1310._4_4_;
        fVar34 = local_11d0._8_4_ * local_1360._4_4_ +
                 local_11b0._8_4_ * local_1370._4_4_ + local_11c0._8_4_ * local_1310._4_4_;
        fVar35 = local_11d0._12_4_ * local_1360._4_4_ +
                 local_11b0._12_4_ * local_1370._4_4_ + local_11c0._12_4_ * local_1310._4_4_;
        auVar30._0_4_ = fVar27 + fVar27;
        auVar30._4_4_ = fVar33 + fVar33;
        auVar30._8_4_ = fVar34 + fVar34;
        auVar30._12_4_ = fVar35 + fVar35;
        fVar27 = local_11d0._0_4_ * fVar4 + local_11b0._0_4_ * fVar150 + local_11c0._0_4_ * fVar3;
        fVar33 = local_11d0._4_4_ * fVar13 + local_11b0._4_4_ * fVar155 + local_11c0._4_4_ * fVar5;
        fVar68 = local_11d0._8_4_ * fVar69 + local_11b0._8_4_ * fVar157 + local_11c0._8_4_ * fVar68;
        fVar69 = local_11d0._12_4_ * fVar110 +
                 local_11b0._12_4_ * fVar159 + local_11c0._12_4_ * fVar102;
        auVar37 = vrcpps_avx(auVar30);
        fVar3 = auVar37._0_4_;
        auVar108._0_4_ = auVar30._0_4_ * fVar3;
        fVar4 = auVar37._4_4_;
        auVar108._4_4_ = auVar30._4_4_ * fVar4;
        fVar5 = auVar37._8_4_;
        auVar108._8_4_ = auVar30._8_4_ * fVar5;
        fVar13 = auVar37._12_4_;
        auVar108._12_4_ = auVar30._12_4_ * fVar13;
        auVar119._8_4_ = 0x3f800000;
        auVar119._0_8_ = 0x3f8000003f800000;
        auVar119._12_4_ = 0x3f800000;
        auVar37 = vsubps_avx(auVar119,auVar108);
        fVar102 = fVar3 * auVar37._0_4_;
        fVar110 = fVar4 * auVar37._4_4_;
        fVar34 = fVar5 * auVar37._8_4_;
        fVar35 = fVar13 * auVar37._12_4_;
        local_11e0._0_4_ = (fVar27 + fVar27) * (fVar3 + fVar102);
        local_11e0._4_4_ = (fVar33 + fVar33) * (fVar4 + fVar110);
        local_11e0._8_4_ = (fVar68 + fVar68) * (fVar5 + fVar34);
        local_11e0._12_4_ = (fVar69 + fVar69) * (fVar13 + fVar35);
        auVar32 = ZEXT1664(local_11e0);
        uVar15 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar66._4_4_ = uVar15;
        auVar66._0_4_ = uVar15;
        auVar66._8_4_ = uVar15;
        auVar66._12_4_ = uVar15;
        auVar37 = vcmpps_avx(auVar66,local_11e0,2);
        uVar15 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar127._4_4_ = uVar15;
        auVar127._0_4_ = uVar15;
        auVar127._8_4_ = uVar15;
        auVar127._12_4_ = uVar15;
        auVar98 = ZEXT1664(auVar127);
        auVar57 = vcmpps_avx(local_11e0,auVar127,2);
        auVar37 = vandps_avx(auVar57,auVar37);
        auVar57 = auVar28 & auVar37;
        if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar57[0xf] < '\0') {
          auVar28 = vandps_avx(auVar28,auVar37);
          auVar37 = vcmpps_avx(auVar30,_DAT_01f45a50,4);
          auVar57 = auVar37 & auVar28;
          if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar57[0xf] < '\0') {
            local_1300 = vandps_avx(auVar28,auVar37);
            local_1220 = &local_1389;
            local_1310 = (long)context->scene;
            auVar28 = vrcpps_avx(local_1230);
            fVar3 = auVar28._0_4_;
            auVar52._0_4_ = local_1230._0_4_ * fVar3;
            fVar4 = auVar28._4_4_;
            auVar52._4_4_ = local_1230._4_4_ * fVar4;
            fVar5 = auVar28._8_4_;
            auVar52._8_4_ = local_1230._8_4_ * fVar5;
            fVar13 = auVar28._12_4_;
            auVar52._12_4_ = local_1230._12_4_ * fVar13;
            auVar67._8_4_ = 0x3f800000;
            auVar67._0_8_ = 0x3f8000003f800000;
            auVar67._12_4_ = 0x3f800000;
            auVar28 = vsubps_avx(auVar67,auVar52);
            auVar41._0_4_ = fVar3 + fVar3 * auVar28._0_4_;
            auVar41._4_4_ = fVar4 + fVar4 * auVar28._4_4_;
            auVar41._8_4_ = fVar5 + fVar5 * auVar28._8_4_;
            auVar41._12_4_ = fVar13 + fVar13 * auVar28._12_4_;
            auVar53._8_4_ = 0x219392ef;
            auVar53._0_8_ = 0x219392ef219392ef;
            auVar53._12_4_ = 0x219392ef;
            auVar28 = vcmpps_avx(local_1110,auVar53,5);
            auVar28 = vandps_avx(auVar28,auVar41);
            auVar54._0_4_ = local_1250._0_4_ * auVar28._0_4_;
            auVar54._4_4_ = local_1250._4_4_ * auVar28._4_4_;
            auVar54._8_4_ = local_1250._8_4_ * auVar28._8_4_;
            auVar54._12_4_ = local_1250._12_4_ * auVar28._12_4_;
            local_1200 = vminps_avx(auVar54,auVar67);
            auVar42._0_4_ = local_1240._0_4_ * auVar28._0_4_;
            auVar42._4_4_ = local_1240._4_4_ * auVar28._4_4_;
            auVar42._8_4_ = local_1240._8_4_ * auVar28._8_4_;
            auVar42._12_4_ = local_1240._12_4_ * auVar28._12_4_;
            local_11f0 = vminps_avx(auVar42,auVar67);
            auVar55._8_4_ = 0x7f800000;
            auVar55._0_8_ = 0x7f8000007f800000;
            auVar55._12_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar55,local_11e0,local_1300);
            auVar37 = vshufps_avx(auVar28,auVar28,0xb1);
            auVar37 = vminps_avx(auVar37,auVar28);
            auVar57 = vshufpd_avx(auVar37,auVar37,1);
            auVar37 = vminps_avx(auVar57,auVar37);
            auVar28 = vcmpps_avx(auVar28,auVar37,0);
            auVar57 = local_1300 & auVar28;
            auVar37 = vpcmpeqd_avx(auVar37,auVar37);
            if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar57[0xf] < '\0') {
              auVar37 = auVar28;
            }
            lVar18 = lVar18 + uVar24;
            auVar28 = vandps_avx(local_1300,auVar37);
            uVar15 = vmovmskps_avx(auVar28);
            uVar16 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar15);
            lVar17 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            auVar56 = ZEXT1632(CONCAT412(fVar35,CONCAT48(fVar34,CONCAT44(fVar110,fVar102))));
            auVar56 = vcmpps_avx(auVar56,auVar56,0xf);
            auVar109 = ZEXT3264(auVar56);
            local_1370 = lVar18;
            local_1210 = local_1300;
LAB_00f6c85c:
            uVar19 = *(uint *)(lVar18 + 0x120 + lVar17 * 4);
            lVar18 = *(long *)(*(long *)(local_1310 + 0x1e8) + (ulong)uVar19 * 8);
            local_1360 = lVar18;
            if ((*(uint *)(lVar18 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_1300 + lVar17 * 4) = 0;
              lVar18 = local_1370;
            }
            else {
              local_1320._0_8_ = lVar17;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (*(long *)(lVar18 + 0x40) == 0)) {
                uVar15 = *(undefined4 *)(local_1200 + lVar17 * 4);
                uVar7 = *(undefined4 *)(local_11f0 + lVar17 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + lVar17 * 4);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_11d0 + lVar17 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_11c0 + lVar17 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11b0 + lVar17 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar15;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar7;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)(local_1370 + 0x130 + lVar17 * 4);
                *(uint *)(ray + k * 4 + 0x240) = uVar19;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                goto LAB_00f6cd5d;
              }
              local_1060 = *(undefined4 *)(local_1200 + lVar17 * 4);
              local_1040 = *(undefined4 *)(local_11f0 + lVar17 * 4);
              pRVar11 = context->user;
              local_1380._0_8_ = pRVar11;
              auStack_ff0 = vpshufd_avx(ZEXT416(uVar19),0);
              local_1020 = *(undefined4 *)(local_1370 + 0x130 + lVar17 * 4);
              uVar15 = *(undefined4 *)(local_11d0 + lVar17 * 4);
              uVar7 = *(undefined4 *)(local_11c0 + lVar17 * 4);
              local_10a0._4_4_ = uVar7;
              local_10a0._0_4_ = uVar7;
              local_10a0._8_4_ = uVar7;
              local_10a0._12_4_ = uVar7;
              local_10a0._16_4_ = uVar7;
              local_10a0._20_4_ = uVar7;
              local_10a0._24_4_ = uVar7;
              local_10a0._28_4_ = uVar7;
              uVar7 = *(undefined4 *)(local_11b0 + lVar17 * 4);
              local_1080._4_4_ = uVar7;
              local_1080._0_4_ = uVar7;
              local_1080._8_4_ = uVar7;
              local_1080._12_4_ = uVar7;
              local_1080._16_4_ = uVar7;
              local_1080._20_4_ = uVar7;
              local_1080._24_4_ = uVar7;
              local_1080._28_4_ = uVar7;
              local_10c0[0] = (RTCHitN)(char)uVar15;
              local_10c0[1] = (RTCHitN)(char)((uint)uVar15 >> 8);
              local_10c0[2] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
              local_10c0[3] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
              local_10c0[4] = (RTCHitN)(char)uVar15;
              local_10c0[5] = (RTCHitN)(char)((uint)uVar15 >> 8);
              local_10c0[6] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
              local_10c0[7] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
              local_10c0[8] = (RTCHitN)(char)uVar15;
              local_10c0[9] = (RTCHitN)(char)((uint)uVar15 >> 8);
              local_10c0[10] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
              local_10c0[0xb] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
              local_10c0[0xc] = (RTCHitN)(char)uVar15;
              local_10c0[0xd] = (RTCHitN)(char)((uint)uVar15 >> 8);
              local_10c0[0xe] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
              local_10c0[0xf] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
              local_10c0[0x10] = (RTCHitN)(char)uVar15;
              local_10c0[0x11] = (RTCHitN)(char)((uint)uVar15 >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
              local_10c0[0x14] = (RTCHitN)(char)uVar15;
              local_10c0[0x15] = (RTCHitN)(char)((uint)uVar15 >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
              local_10c0[0x18] = (RTCHitN)(char)uVar15;
              local_10c0[0x19] = (RTCHitN)(char)((uint)uVar15 >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
              local_10c0[0x1c] = (RTCHitN)(char)uVar15;
              local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar15 >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
              uStack_105c = local_1060;
              uStack_1058 = local_1060;
              uStack_1054 = local_1060;
              uStack_1050 = local_1060;
              uStack_104c = local_1060;
              uStack_1048 = local_1060;
              uStack_1044 = local_1060;
              uStack_103c = local_1040;
              uStack_1038 = local_1040;
              uStack_1034 = local_1040;
              uStack_1030 = local_1040;
              uStack_102c = local_1040;
              uStack_1028 = local_1040;
              uStack_1024 = local_1040;
              uStack_101c = local_1020;
              uStack_1018 = local_1020;
              uStack_1014 = local_1020;
              uStack_1010 = local_1020;
              uStack_100c = local_1020;
              uStack_1008 = local_1020;
              uStack_1004 = local_1020;
              local_1000 = auStack_ff0;
              uStack_fdc = pRVar11->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = pRVar11->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + lVar17 * 4);
              local_12c0 = *local_12d8;
              local_12b0 = *local_12e0;
              local_1290.valid = (int *)local_12c0;
              local_1290.geometryUserPtr = *(void **)(lVar18 + 0x18);
              local_1290.context = context->user;
              local_1290.hit = local_10c0;
              local_1290.N = 8;
              local_1290.ray = (RTCRayN *)ray;
              if (*(code **)(lVar18 + 0x40) != (code *)0x0) {
                local_1330._0_8_ = lVar21;
                local_1380._0_8_ = pauVar20;
                local_1340 = auVar32._0_16_;
                local_1350 = auVar98._0_16_;
                auVar56 = ZEXT1632(auVar109._0_16_);
                (**(code **)(lVar18 + 0x40))(&local_1290);
                auVar98 = ZEXT1664(local_1350);
                auVar32 = ZEXT1664(local_1340);
                auVar56 = vcmpps_avx(auVar56,auVar56,0xf);
                auVar109 = ZEXT3264(auVar56);
                pauVar20 = (undefined1 (*) [16])local_1380._0_8_;
                lVar21 = local_1330._0_8_;
                uVar22 = local_1388;
                ray = local_12e8;
                k = local_12f0;
              }
              auVar28 = vpcmpeqd_avx(local_12c0,ZEXT816(0) << 0x40);
              auVar37 = vpcmpeqd_avx(local_12b0,ZEXT816(0) << 0x40);
              auVar56._16_16_ = auVar37;
              auVar56._0_16_ = auVar28;
              auVar56 = auVar109._0_32_ & ~auVar56;
              if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar56 >> 0x7f,0) == '\0') &&
                    (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar56 >> 0xbf,0) == '\0') &&
                  (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar56[0x1f]) {
                auVar31._0_4_ = auVar28._0_4_ ^ auVar109._0_4_;
                auVar31._4_4_ = auVar28._4_4_ ^ auVar109._4_4_;
                auVar31._8_4_ = auVar28._8_4_ ^ auVar109._8_4_;
                auVar31._12_4_ = auVar28._12_4_ ^ auVar109._12_4_;
                auVar31._16_4_ = auVar37._0_4_ ^ auVar109._16_4_;
                auVar31._20_4_ = auVar37._4_4_ ^ auVar109._20_4_;
                auVar31._24_4_ = auVar37._8_4_ ^ auVar109._24_4_;
                auVar31._28_4_ = auVar37._12_4_ ^ auVar109._28_4_;
              }
              else {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(local_1360 + 0x3e) & 0x40) != 0)))
                   ) {
                  local_1330._0_8_ = lVar21;
                  local_1380._0_8_ = pauVar20;
                  local_1340 = auVar32._0_16_;
                  local_1350 = auVar98._0_16_;
                  auVar56 = ZEXT1632(auVar109._0_16_);
                  (*p_Var12)(&local_1290);
                  auVar98 = ZEXT1664(local_1350);
                  auVar32 = ZEXT1664(local_1340);
                  auVar56 = vcmpps_avx(auVar56,auVar56,0xf);
                  auVar109 = ZEXT3264(auVar56);
                  pauVar20 = (undefined1 (*) [16])local_1380._0_8_;
                  lVar21 = local_1330._0_8_;
                  uVar22 = local_1388;
                  ray = local_12e8;
                  k = local_12f0;
                }
                auVar28 = vpcmpeqd_avx(local_12c0,ZEXT816(0) << 0x40);
                auVar37 = vpcmpeqd_avx(local_12b0,ZEXT816(0) << 0x40);
                auVar44._16_16_ = auVar37;
                auVar44._0_16_ = auVar28;
                auVar31._0_4_ = auVar28._0_4_ ^ auVar109._0_4_;
                auVar31._4_4_ = auVar28._4_4_ ^ auVar109._4_4_;
                auVar31._8_4_ = auVar28._8_4_ ^ auVar109._8_4_;
                auVar31._12_4_ = auVar28._12_4_ ^ auVar109._12_4_;
                auVar31._16_4_ = auVar37._0_4_ ^ auVar109._16_4_;
                auVar31._20_4_ = auVar37._4_4_ ^ auVar109._20_4_;
                auVar31._24_4_ = auVar37._8_4_ ^ auVar109._24_4_;
                auVar31._28_4_ = auVar37._12_4_ ^ auVar109._28_4_;
                auVar56 = auVar109._0_32_ & ~auVar44;
                if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar56 >> 0x7f,0) != '\0') ||
                      (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar56 >> 0xbf,0) != '\0') ||
                    (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar56[0x1f] < '\0') {
                  auVar56 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])local_1290.hit);
                  *(undefined1 (*) [32])(local_1290.ray + 0x180) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])(local_1290.hit + 0x20));
                  *(undefined1 (*) [32])(local_1290.ray + 0x1a0) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])(local_1290.hit + 0x40));
                  *(undefined1 (*) [32])(local_1290.ray + 0x1c0) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])(local_1290.hit + 0x60));
                  *(undefined1 (*) [32])(local_1290.ray + 0x1e0) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])(local_1290.hit + 0x80));
                  *(undefined1 (*) [32])(local_1290.ray + 0x200) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])(local_1290.hit + 0xa0));
                  *(undefined1 (*) [32])(local_1290.ray + 0x220) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])(local_1290.hit + 0xc0));
                  *(undefined1 (*) [32])(local_1290.ray + 0x240) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])(local_1290.hit + 0xe0));
                  *(undefined1 (*) [32])(local_1290.ray + 0x260) = auVar56;
                  auVar56 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])(local_1290.hit + 0x100));
                  *(undefined1 (*) [32])(local_1290.ray + 0x280) = auVar56;
                }
              }
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar31 >> 0x7f,0) == '\0') &&
                    (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar31 >> 0xbf,0) == '\0') &&
                  (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar31[0x1f]) {
                *(int *)(ray + k * 4 + 0x100) = auVar98._0_4_;
              }
              else {
                auVar98 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_1300 + local_1320._0_8_ * 4) = 0;
              auVar28 = vshufps_avx(auVar98._0_16_,auVar98._0_16_,0);
              auVar28 = vcmpps_avx(auVar32._0_16_,auVar28,2);
              local_1300 = vandps_avx(auVar28,local_1300);
              lVar17 = local_1320._0_8_;
              lVar18 = local_1370;
            }
            if ((((local_1300 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_1300 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_1300 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_1300[0xf]) goto LAB_00f6cd5d;
            auVar43._8_4_ = 0x7f800000;
            auVar43._0_8_ = 0x7f8000007f800000;
            auVar43._12_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar43,auVar32._0_16_,local_1300);
            auVar37 = vshufps_avx(auVar28,auVar28,0xb1);
            auVar37 = vminps_avx(auVar37,auVar28);
            auVar57 = vshufpd_avx(auVar37,auVar37,1);
            auVar37 = vminps_avx(auVar57,auVar37);
            auVar37 = vcmpps_avx(auVar28,auVar37,0);
            auVar57 = local_1300 & auVar37;
            auVar28 = local_1300;
            if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar57[0xf] < '\0') {
              auVar28 = vandps_avx(auVar37,local_1300);
            }
            uVar15 = vmovmskps_avx(auVar28);
            uVar16 = CONCAT44((int)((ulong)lVar17 >> 0x20),uVar15);
            lVar17 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            goto LAB_00f6c85c;
          }
        }
      }
LAB_00f6cd5d:
      auVar109 = ZEXT1664(local_1120);
      auVar120 = ZEXT1664(local_1130);
      auVar128 = ZEXT1664(local_1140);
      auVar131 = ZEXT1664(local_1150);
      auVar137 = ZEXT1664(local_1160);
      auVar142 = ZEXT1664(local_1170);
      auVar146 = ZEXT1664(local_1180);
      auVar154 = ZEXT1664(local_1190);
      auVar164 = ZEXT1664(local_11a0);
      auVar98 = ZEXT1664(local_1260);
    }
    uVar15 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar32 = ZEXT1664(CONCAT412(uVar15,CONCAT48(uVar15,CONCAT44(uVar15,uVar15))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }